

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

OPJ_BOOL bmp_read_rle8_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  OPJ_BOOL OVar4;
  OPJ_UINT8 *pOVar5;
  uint uVar6;
  int iVar7;
  OPJ_UINT8 *pOVar8;
  OPJ_UINT8 *__s;
  uint uVar9;
  
  if (height == 0) {
    iVar7 = 0;
  }
  else {
    pOVar5 = pData + height * stride;
    uVar9 = 0;
    uVar6 = 0;
    iVar7 = 0;
    __s = pData;
    do {
      iVar1 = getc((FILE *)IN);
      if (iVar1 == 0) {
        uVar3 = getc((FILE *)IN);
        switch(uVar3) {
        case 0:
          uVar6 = uVar6 + 1;
          __s = pData + uVar6 * stride;
          uVar9 = 0;
          break;
        case 1:
          goto switchD_0010a798_caseD_1;
        case 2:
          iVar1 = getc((FILE *)IN);
          if ((iVar1 == -1) || (iVar2 = getc((FILE *)IN), iVar2 == -1))
          goto switchD_0010a798_caseD_ffffffff;
          uVar9 = iVar1 + uVar9;
          uVar6 = uVar6 + iVar2;
          __s = pData + (ulong)(uVar6 * stride) + (ulong)uVar9;
          break;
        case 0xffffffff:
          goto switchD_0010a798_caseD_ffffffff;
        default:
          if (((0 < (int)uVar3) && (uVar9 < width)) && (__s < pOVar5)) {
            iVar1 = 1;
            do {
              iVar2 = getc((FILE *)IN);
              if (iVar2 == -1) goto switchD_0010a798_caseD_ffffffff;
              *__s = (OPJ_UINT8)iVar2;
              iVar7 = iVar7 + 1;
              uVar9 = uVar9 + 1;
              __s = __s + 1;
            } while (((iVar1 < (int)uVar3) && (uVar9 < width)) && (iVar1 = iVar1 + 1, __s < pOVar5))
            ;
          }
          if (((uVar3 & 1) != 0) && (iVar1 = getc((FILE *)IN), iVar1 == -1))
          goto switchD_0010a798_caseD_ffffffff;
        }
      }
      else {
        if ((iVar1 == -1) || (iVar2 = getc((FILE *)IN), iVar2 == -1))
        goto switchD_0010a798_caseD_ffffffff;
        if ((0 < iVar1) && ((uVar9 < width && (__s < pOVar5)))) {
          pOVar8 = pOVar5 + ~(ulong)__s;
          if ((OPJ_UINT8 *)(ulong)(~uVar9 + width) <= pOVar5 + ~(ulong)__s) {
            pOVar8 = (OPJ_UINT8 *)(ulong)(~uVar9 + width);
          }
          if ((OPJ_UINT8 *)(ulong)(iVar1 - 1) <= pOVar8) {
            pOVar8 = (OPJ_UINT8 *)(ulong)(iVar1 - 1);
          }
          memset(__s,iVar2,(size_t)(pOVar8 + 1));
          iVar7 = iVar7 + (int)pOVar8 + 1;
          uVar9 = uVar9 + (int)pOVar8 + 1;
          __s = __s + (long)pOVar8 + 1;
        }
      }
    } while (uVar6 < height);
  }
switchD_0010a798_caseD_1:
  OVar4 = 1;
  if (iVar7 != height * width) {
    bmp_read_rle8_data_cold_1();
switchD_0010a798_caseD_ffffffff:
    OVar4 = 0;
  }
  return OVar4;
}

Assistant:

static OPJ_BOOL bmp_read_rle8_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;

    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) {
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = c1;
                written++;
            }
        } else {
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                ++y;
                pix = pData + y * stride + x;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 */
                int j;
                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    int c1_int;
                    OPJ_UINT8 c1;
                    c1_int = getc(IN);
                    if (c1_int == EOF) {
                        return OPJ_FALSE;
                    }
                    c1 = (OPJ_UINT8)c1_int;
                    *pix = c1;
                    written++;
                }
                if ((OPJ_UINT32)c & 1U) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }/* while() */

    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}